

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

uint8_t fio_cluster_on_shutdown(intptr_t uuid,fio_protocol_s *pr_)

{
  _func_uint8_t_intptr_t_fio_protocol_s_ptr *p_Var1;
  fio_str_info_s ch;
  fio_str_info_s data;
  fio_msg_internal_s *pfVar2;
  undefined8 local_50;
  undefined8 local_48;
  char *local_40;
  undefined8 local_38;
  undefined8 local_30;
  char *local_28;
  fio_protocol_s *local_20;
  cluster_pr_s *p;
  fio_protocol_s *pr__local;
  intptr_t uuid_local;
  
  p_Var1 = pr_[1].on_shutdown;
  local_20 = pr_;
  p = (cluster_pr_s *)pr_;
  pr__local = (fio_protocol_s *)uuid;
  memset(&local_38,0,0x18);
  memset(&local_50,0,0x18);
  ch.len = local_30;
  ch.capa = local_38;
  ch.data = local_28;
  data.len = local_48;
  data.capa = local_50;
  data.data = local_40;
  pfVar2 = fio_msg_internal_create(0,8,ch,data,'\0','\x01');
  (*p_Var1)((intptr_t)pfVar2,(fio_protocol_s *)0xffffffffffffffff);
  return 0xff;
}

Assistant:

static uint8_t fio_cluster_on_shutdown(intptr_t uuid, fio_protocol_s *pr_) {
  cluster_pr_s *p = (cluster_pr_s *)pr_;
  p->sender(fio_msg_internal_create(0, FIO_CLUSTER_MSG_SHUTDOWN,
                                    (fio_str_info_s){.len = 0},
                                    (fio_str_info_s){.len = 0}, 0, 1),
            -1);
  return 255;
  (void)pr_;
  (void)uuid;
}